

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeMemMMGPImm7Lsl2(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint RC;
  uint32_t RegNo;
  uint Reg_00;
  MCRegisterInfo *in_RCX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Reg;
  uint Offset;
  
  RC = in_ESI & 0x7f;
  RegNo = fieldFromInstruction(in_ESI,7,3);
  Reg_00 = getReg(in_RCX,RC,RegNo);
  MCOperand_CreateReg0(in_RDI,Reg_00);
  MCOperand_CreateReg0(in_RDI,9);
  MCOperand_CreateImm0(in_RDI,(ulong)(RC << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMemMMGPImm7Lsl2(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Offset = Insn & 0x7F;
	unsigned Reg = fieldFromInstruction(Insn, 7, 3);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Mips_GP);
	MCOperand_CreateImm0(Inst, Offset << 2);

	return MCDisassembler_Success;
}